

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_vec2 nk_widget_position(nk_context *ctx)

{
  nk_vec2 nVar1;
  float fVar2;
  float fVar3;
  nk_rect bounds;
  nk_rect local_18;
  
  fVar2 = 0.0;
  fVar3 = 0.0;
  if ((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) {
    nk_layout_peek(&local_18,ctx);
    fVar2 = local_18.x;
    fVar3 = local_18.y;
  }
  nVar1.y = fVar3;
  nVar1.x = fVar2;
  return nVar1;
}

Assistant:

NK_API struct nk_vec2
nk_widget_position(struct nk_context *ctx)
{
struct nk_rect bounds;
NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
if (!ctx || !ctx->current)
return nk_vec2(0,0);

nk_layout_peek(&bounds, ctx);
return nk_vec2(bounds.x, bounds.y);
}